

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::StartArray(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *this)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  
  Prefix(this,kArrayType);
  pcVar1 = (this->level_stack_).stackTop_;
  if ((this->level_stack_).stackEnd_ < pcVar1 + 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
              (&this->level_stack_,1);
    pcVar1 = (this->level_stack_).stackTop_;
  }
  (this->level_stack_).stackTop_ = pcVar1 + 0x10;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\x01';
  this_00 = &this->os_->stack_;
  pcVar1 = this_00->stackTop_;
  if (this_00->stackEnd_ < pcVar1 + 1) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,1);
    pcVar1 = this_00->stackTop_;
  }
  this_00->stackTop_ = pcVar1 + 1;
  *pcVar1 = '[';
  return true;
}

Assistant:

bool StartArray() {
        Prefix(kArrayType);
        new (level_stack_.template Push<Level>()) Level(true);
        return WriteStartArray();
    }